

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseRegisterCommand(WastParser *this,CommandPtr *out_command)

{
  Command *pCVar1;
  string_view module_name;
  Result RVar2;
  RegisterCommand *this_00;
  Enum EVar3;
  Location local_128;
  Var local_100;
  undefined1 auStack_b8 [8];
  Var var;
  undefined1 auStack_68 [8];
  Location loc;
  string text;
  
  RVar2 = Expect(this,Lpar);
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    GetToken((Token *)auStack_b8,this);
    loc.filename.size_ = var.loc.filename.size_;
    loc.field_1.field_1.offset = var.loc.field_1.field_1.offset;
    auStack_68 = auStack_b8;
    loc.filename.data_ = var.loc.filename.data_;
    Token::~Token((Token *)auStack_b8);
    RVar2 = Expect(this,Register);
    EVar3 = Error;
    if (RVar2.enum_ != Error) {
      text._M_dataplus._M_p = (pointer)0x0;
      text._M_string_length._0_1_ = 0;
      local_128.field_1.field_0.line = 0;
      local_128.field_1._4_8_ = 0;
      local_128.filename.data_ = (char *)0x0;
      local_128.filename.size_._0_4_ = 0;
      local_128.filename.size_._4_4_ = 0;
      loc.field_1._8_8_ = &text._M_string_length;
      Var::Var((Var *)auStack_b8,0xffffffff,&local_128);
      RVar2 = ParseQuotedText(this,(string *)((long)&loc.field_1 + 8));
      if (RVar2.enum_ != Error) {
        Var::Var(&local_100,this->last_module_index_,(Location *)auStack_68);
        ParseVarOpt(this,(Var *)auStack_b8,&local_100);
        Var::~Var(&local_100);
        RVar2 = Expect(this,Rpar);
        if (RVar2.enum_ != Error) {
          this_00 = (RegisterCommand *)operator_new(0x78);
          module_name.size_ = (size_type)text._M_dataplus._M_p;
          module_name.data_ = (char *)loc.field_1._8_8_;
          RegisterCommand::RegisterCommand(this_00,module_name,(Var *)auStack_b8);
          pCVar1 = (out_command->_M_t).
                   super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
                   super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
                   super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
          (out_command->_M_t).
          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
          super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = (Command *)this_00;
          EVar3 = Ok;
          if (pCVar1 != (Command *)0x0) {
            (*pCVar1->_vptr_Command[1])();
            EVar3 = Ok;
          }
        }
      }
      Var::~Var((Var *)auStack_b8);
      if ((size_type *)loc.field_1._8_8_ != &text._M_string_length) {
        operator_delete((void *)loc.field_1._8_8_);
      }
    }
  }
  return (Result)EVar3;
}

Assistant:

Result WastParser::ParseRegisterCommand(CommandPtr* out_command) {
  WABT_TRACE(ParseRegisterCommand);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Register);
  std::string text;
  Var var;
  CHECK_RESULT(ParseQuotedText(&text));
  ParseVarOpt(&var, Var(last_module_index_, loc));
  EXPECT(Rpar);
  out_command->reset(new RegisterCommand(text, var));
  return Result::Ok;
}